

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

lyd_node * lyd_new_output(lyd_node *parent,lys_module *module,char *name)

{
  int iVar1;
  lys_node *siblings;
  size_t sVar2;
  lyd_node *plVar3;
  LY_ERR *pLVar4;
  lys_node *local_38;
  lys_node *snode;
  
  local_38 = (lys_node *)0x0;
  if ((parent == (lyd_node *)0x0 && module == (lys_module *)0x0 || name == (char *)0x0) ||
     (siblings = lyd_new_find_schema(parent,module,1), siblings == (lys_node *)0x0)) {
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EINVAL;
  }
  else {
    sVar2 = strlen(name);
    iVar1 = lys_get_data_sibling
                      (module,siblings,name,(int)sVar2,
                       LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER,&local_38);
    if (local_38 != (lys_node *)0x0 && iVar1 == 0) {
      plVar3 = _lyd_new(parent,local_38,0);
      return plVar3;
    }
  }
  return (lyd_node *)0x0;
}

Assistant:

lyd_node *
lyd_new_output(struct lyd_node *parent, const struct lys_module *module, const char *name)
{
    const struct lys_node *snode = NULL, *siblings;

    if ((!parent && !module) || !name) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    siblings = lyd_new_find_schema(parent, module, 1);
    if (!siblings) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    if (lys_get_data_sibling(module, siblings, name, strlen(name), LYS_CONTAINER | LYS_LIST | LYS_NOTIF | LYS_RPC | LYS_ACTION, &snode)
            || !snode) {
        return NULL;
    }

    return _lyd_new(parent, snode, 0);
}